

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O2

void __thiscall
HawkTracer::parser::ProtocolReader::_read_event
          (ProtocolReader *this,bool *is_error,Event *event,Event *base_event)

{
  bool bVar1;
  FieldTypeId FVar2;
  EventKlassField *pEVar3;
  pointer psVar4;
  FieldType value;
  FieldType local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  bool *local_50;
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  local_48;
  
  local_50 = is_error;
  std::__shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2> *)
             &local_60,
             &(event->_klass).
              super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>);
  EventKlass::get_fields(&local_48,(EventKlass *)local_60.f_EVENT);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  psVar4 = local_48.
           super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (psVar4 == local_48.
                  super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
      ::~vector(&local_48);
      *local_50 = false;
      return;
    }
    local_60.f_UINT64 = 0;
    pEVar3 = (psVar4->
             super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    FVar2 = pEVar3->_type_id;
    if ((int)FVar2 < 9) {
      bVar1 = _read_numeric(this,&local_60,pEVar3);
      if (!bVar1) break;
      pEVar3 = (psVar4->
               super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      FVar2 = pEVar3->_type_id;
    }
    if (FVar2 == STRING) {
      bVar1 = _read_string(this,&local_60);
      if (!bVar1) break;
      pEVar3 = (psVar4->
               super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      FVar2 = pEVar3->_type_id;
    }
    if ((FVar2 == STRUCT) && (bVar1 = _read_struct(this,&local_60,pEVar3,event,base_event), !bVar1))
    break;
    pEVar3 = (psVar4->
             super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (this->_flat_events == true) {
      if (pEVar3->_type_id != STRUCT) {
        Event::set_value(event,pEVar3,local_60);
      }
    }
    else {
      Event::set_value(event,pEVar3,local_60);
    }
    psVar4 = psVar4 + 1;
  }
  *local_50 = true;
  std::
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void ProtocolReader::_read_event(bool& is_error, Event& event, Event* base_event)
{
    for (const auto& field : event.get_klass()->get_fields())
    {
        FieldType value{};
        if (((field->is_numeric() || field->get_type_id() == FieldTypeId::POINTER) && !_read_numeric(value, *field)) || // read numeric or pointer
                (field->get_type_id() == FieldTypeId::STRING && !_read_string(value)) || // read string
                (field->get_type_id() == FieldTypeId::STRUCT && !_read_struct(value, *field, &event, base_event))) // read struct
        {
            is_error = true;
            return;
        }

        if (_flat_events)
        {
            if (field->get_type_id() != FieldTypeId::STRUCT)
            {
                event.set_value(field.get(), value);
            }
        }
        else
        {
            event.set_value(field.get(), value);
        }
    }

    is_error = false;
}